

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall AixLog::SinkCout::~SinkCout(SinkCout *this)

{
  void *in_RDI;
  
  ~SinkCout((SinkCout *)0x1cc748);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

SinkCout(const Filter& filter,
           const std::string& format =
               "%Y-%m-%d %H-%M-%S.#ms [#severity] (#tag_func)")
      : SinkFormat(filter, format) {}